

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_WriteObjectRec(BCWriterState *s,JSValue obj)

{
  DynBuf *pDVar1;
  ushort *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  JSMapRecord *pJVar7;
  long lVar8;
  JSObjectListEntry *pJVar9;
  JSProperty *__src;
  JSRuntime *pJVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  uint8_t *data;
  uint8_t uVar14;
  uint32_t v;
  JSString *p;
  uintptr_t sp;
  JSContext *ctx;
  long lVar15;
  size_t size;
  uint uVar16;
  ulong uVar17;
  BCWriterState *pBVar18;
  long lVar19;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue obj_04;
  JSValueUnion local_58;
  ushort local_4e;
  uint32_t local_4c;
  DynBuf *local_48;
  BCWriterState *local_40;
  JSValueUnion local_38;
  
  obj_01.u = obj.u;
  ctx = s->ctx;
  if (&stack0xfffffffffffffff8 < (undefined1 *)ctx->rt->stack_limit) {
    JS_ThrowInternalError(ctx,"stack overflow");
    return -1;
  }
  iVar13 = obj.u._0_4_;
  local_40 = s;
  local_38 = obj_01.u;
  switch((int)obj.tag) {
  case 0:
    dbuf_putc(&s->dbuf,'\x05');
    v = iVar13 >> 0x1f ^ iVar13 * 2;
LAB_0012abdd:
    dbuf_put_leb128(&s->dbuf,v);
    return 0;
  case 1:
    uVar14 = obj.u._0_1_ + '\x03';
    break;
  case 2:
    uVar14 = '\x01';
    break;
  case 3:
    uVar14 = '\x02';
    break;
  case 7:
    dbuf_putc(&s->dbuf,'\x06');
    local_58 = obj_01.u;
    if (s->field_0x38 != '\0') {
      local_58.ptr = (void *)((ulong)obj_01.u.ptr >> 0x38 |
                              ((ulong)obj_01.u.ptr & 0xff000000000000) >> 0x28 |
                              ((ulong)obj_01.u.ptr & 0xff0000000000) >> 0x18 |
                              ((ulong)obj_01.u.ptr & 0xff00000000) >> 8 |
                              ((ulong)obj_01.u.ptr & 0xff000000) << 8 |
                              ((ulong)obj_01.u.ptr & 0xff0000) << 0x18 |
                              ((ulong)obj_01.u.ptr & 0xff00) << 0x28 | (long)obj_01.u.ptr << 0x38);
    }
    dbuf_put(&s->dbuf,(uint8_t *)&local_58.int32,8);
    return 0;
  case -7:
    dbuf_putc(&s->dbuf,'\a');
    JS_WriteString(s,(JSString *)obj_01.u.ptr);
    return 0;
  default:
    goto switchD_0012a873_caseD_fffffffa;
  case -3:
    if (s->field_0x39 == '\0') goto switchD_0012a873_caseD_fffffffa;
    pDVar1 = &s->dbuf;
    dbuf_putc(pDVar1,'\x0f');
    bc_put_atom(s,*(JSAtom *)((long)obj_01.u.ptr + 4));
    dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_01.u.ptr + 0x20));
    if (0 < *(int *)((long)obj_01.u.ptr + 0x20)) {
      lVar19 = 0;
      lVar15 = 0;
      do {
        bc_put_atom(s,*(JSAtom *)
                       ((long)&((*(JSShape **)((long)obj_01.u.ptr + 0x18))->header).ref_count +
                       lVar19));
        lVar15 = lVar15 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar15 < *(int *)((long)obj_01.u.ptr + 0x20));
    }
    dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_01.u.ptr + 0x30));
    if (0 < *(int *)((long)obj_01.u.ptr + 0x30)) {
      lVar15 = 0x18;
      lVar19 = 0;
      do {
        pJVar7 = *(JSMapRecord **)((long)local_38.ptr + 0x28);
        dbuf_putc(pDVar1,*(uint8_t *)((long)pJVar7 + lVar15 + -8));
        iVar13 = *(int *)((long)pJVar7 + lVar15 + -8);
        dbuf_put_leb128(pDVar1,*(uint32_t *)((long)pJVar7 + lVar15 + -0x18));
        pBVar18 = local_40;
        if (iVar13 != 0) {
          bc_put_atom(local_40,*(JSAtom *)((long)pJVar7 + lVar15 + -4));
        }
        bc_put_atom(pBVar18,*(JSAtom *)((long)&pJVar7->ref_count + lVar15));
        lVar19 = lVar19 + 1;
        lVar15 = lVar15 + 0x20;
      } while (lVar19 < *(int *)((long)local_38.ptr + 0x30));
    }
    obj_01.u = local_38;
    dbuf_put_leb128(pDVar1,*(uint32_t *)((long)local_38.ptr + 0x40));
    if (0 < *(int *)((long)obj_01.u.ptr + 0x40)) {
      lVar15 = 0;
      do {
        dbuf_put_leb128(pDVar1,*(uint32_t *)(*(long *)((long)obj_01.u.ptr + 0x38) + lVar15 * 4));
        lVar15 = lVar15 + 1;
      } while (lVar15 < *(int *)((long)obj_01.u.ptr + 0x40));
    }
    dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_01.u.ptr + 0x50));
    pBVar18 = local_40;
    if (0 < *(int *)((long)obj_01.u.ptr + 0x50)) {
      lVar15 = 8;
      lVar19 = 0;
      do {
        lVar8 = *(long *)&((JSObject *)((long)local_38.ptr + 0x48))->field_0;
        dbuf_put_leb128(pDVar1,*(uint32_t *)(lVar8 + -8 + lVar15));
        bc_put_atom(pBVar18,*(JSAtom *)(lVar8 + -4 + lVar15));
        obj_01.u = local_38;
        dbuf_put_leb128(pDVar1,*(uint32_t *)(lVar8 + lVar15));
        lVar19 = lVar19 + 1;
        lVar15 = lVar15 + 0xc;
      } while (lVar19 < *(int *)((long)obj_01.u.ptr + 0x50));
    }
    iVar13 = JS_WriteObjectRec(pBVar18,*(JSValue *)((long)obj_01.u.ptr + 0x68));
    goto LAB_0012af81;
  case -2:
    if (s->field_0x39 != '\0') {
      pDVar1 = &s->dbuf;
      dbuf_putc(pDVar1,'\x0e');
      uVar11 = *(ushort *)((long)obj_01.u.ptr + 0x19) & 0xfff;
      local_4e = uVar11 << 8 | uVar11 >> 8;
      if (s->field_0x38 == '\0') {
        local_4e = uVar11;
      }
      dbuf_put(pDVar1,(uint8_t *)&local_4e,2);
      dbuf_putc(pDVar1,*(uint8_t *)((long)obj_01.u.ptr + 0x18));
      bc_put_atom(s,*(JSAtom *)((long)obj_01.u.ptr + 0x2c));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_01.u.ptr + 0x40));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_01.u.ptr + 0x42));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_01.u.ptr + 0x44));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_01.u.ptr + 0x46));
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_01.u.ptr + 0x5c));
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_01.u.ptr + 0x58));
      local_48 = pDVar1;
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_01.u.ptr + 0x28));
      if (((anon_union_24_22_bbf4f0e3_for_u *)((long)obj_01.u.ptr + 0x30))->opaque == (void *)0x0) {
        dbuf_putc(local_48,'\0');
        pBVar18 = local_40;
      }
      else {
        dbuf_put_leb128(local_48,(uint)*(ushort *)((long)obj_01.u.ptr + 0x42) +
                                 (uint)*(ushort *)((long)obj_01.u.ptr + 0x40));
        pBVar18 = local_40;
        if (*(short *)((long)obj_01.u.ptr + 0x42) != 0 || *(short *)((long)obj_01.u.ptr + 0x40) != 0
           ) {
          lVar15 = 0xc;
          uVar17 = 0;
          do {
            pvVar6 = ((anon_union_24_22_bbf4f0e3_for_u *)((long)obj_01.u.ptr + 0x30))->opaque;
            bc_put_atom(pBVar18,*(JSAtom *)((long)pvVar6 + lVar15 + -0xc));
            pDVar1 = local_48;
            dbuf_put_leb128(local_48,*(uint32_t *)((long)pvVar6 + lVar15 + -8));
            dbuf_put_leb128(pDVar1,*(int *)((long)pvVar6 + lVar15 + -4) + 1);
            obj_01.u = local_38;
            dbuf_putc(pDVar1,(byte)((*(uint *)((long)pvVar6 + lVar15) & 7) << 4) |
                             (byte)(*(uint *)((long)pvVar6 + lVar15) >> 3) & 0xf);
            uVar17 = uVar17 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar17 < (ulong)*(ushort *)((long)obj_01.u.ptr + 0x42) +
                            (ulong)*(ushort *)((long)obj_01.u.ptr + 0x40));
        }
      }
      if (0 < *(int *)((long)obj_01.u.ptr + 0x5c)) {
        lVar15 = 0;
        do {
          lVar19 = *(long *)((long)obj_01.u.ptr + 0x38);
          bc_put_atom(pBVar18,*(JSAtom *)(lVar19 + 4 + lVar15 * 8));
          pDVar1 = local_48;
          dbuf_put_leb128(local_48,(uint)*(ushort *)(lVar19 + 2 + lVar15 * 8));
          obj_01.u = local_38;
          dbuf_putc(pDVar1,*(uint8_t *)(lVar19 + lVar15 * 8));
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)((long)obj_01.u.ptr + 0x5c));
      }
      __src = *(JSProperty **)((long)obj_01.u.ptr + 0x20);
      iVar13 = *(int *)((long)obj_01.u.ptr + 0x28);
      size = (size_t)iVar13;
      data = (uint8_t *)js_malloc(pBVar18->ctx,size);
      if (data == (uint8_t *)0x0) {
        return -1;
      }
      memcpy(data,__src,size);
      if (0 < iVar13) {
        uVar16 = 0;
        do {
          bVar3 = data[uVar16];
          uVar4 = bVar3 + 0xf;
          if (bVar3 < 0xb2) {
            uVar4 = (uint)bVar3;
          }
          bVar3 = opcode_info[uVar4].size;
          if ((byte)(opcode_info[uVar4].fmt - 0x17) < 5) {
            iVar12 = bc_atom_to_idx(local_40,&local_4c,*(JSAtom *)(data + (ulong)uVar16 + 1));
            if (iVar12 != 0) {
              pJVar10 = local_40->ctx->rt;
              (*(pJVar10->mf).js_free)(&pJVar10->malloc_state,data);
              return -1;
            }
            *(uint32_t *)(data + (ulong)uVar16 + 1) = local_4c;
          }
          uVar16 = uVar16 + bVar3;
        } while ((int)uVar16 < iVar13);
        pBVar18 = local_40;
        if (local_40->field_0x38 != '\0') {
          uVar16 = 0;
          do {
            bVar3 = data[uVar16];
            uVar4 = bVar3 + 0xf;
            if (bVar3 < 0xb2) {
              uVar4 = (uint)bVar3;
            }
            bVar3 = opcode_info[uVar4].size;
            uVar14 = opcode_info[uVar4].fmt;
            switch(uVar14) {
            case '\n':
            case '\v':
            case '\f':
            case '\r':
            case '\x10':
            case '\x11':
            case '\x12':
              puVar2 = (ushort *)(data + (ulong)uVar16 + 1);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
              break;
            case '\x0f':
              puVar2 = (ushort *)(data + (ulong)uVar16 + 1);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
              puVar2 = (ushort *)(data + (ulong)uVar16 + 3);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
              break;
            case '\x13':
            case '\x14':
            case '\x15':
            case '\x16':
            case '\x17':
            case '\x18':
              uVar4 = *(uint *)(data + (ulong)uVar16 + 1);
              *(uint *)(data + (ulong)uVar16 + 1) =
                   uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
              break;
            case '\x19':
            case '\x1c':
              uVar4 = *(uint *)(data + (ulong)uVar16 + 1);
              *(uint *)(data + (ulong)uVar16 + 1) =
                   uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
              puVar2 = (ushort *)(data + (ulong)uVar16 + 5);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
              break;
            case '\x1a':
            case '\x1b':
              uVar4 = *(uint *)(data + (ulong)uVar16 + 1);
              uVar5 = *(uint *)(data + (ulong)uVar16 + 5);
              *(uint *)(data + (ulong)uVar16 + 1) =
                   uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
              *(uint *)(data + (ulong)uVar16 + 5) =
                   uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
              if (uVar14 == '\x1b') {
                puVar2 = (ushort *)(data + (ulong)uVar16 + 9);
                *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
              }
            }
            uVar16 = uVar16 + bVar3;
          } while ((int)uVar16 < iVar13);
        }
      }
      dbuf_put(local_48,data,size);
      pJVar10 = pBVar18->ctx->rt;
      (*(pJVar10->mf).js_free)(&pJVar10->malloc_state,data);
      if ((*(byte *)((long)obj_01.u.ptr + 0x1a) & 4) != 0) {
        bc_put_atom(pBVar18,*(JSAtom *)((long)obj_01.u.ptr + 0x60));
        pDVar1 = local_48;
        dbuf_put_leb128(local_48,*(uint32_t *)((long)obj_01.u.ptr + 100));
        dbuf_put_leb128(pDVar1,*(uint32_t *)((long)local_38.ptr + 0x6c));
        obj_01.u = local_38;
        dbuf_put(pDVar1,(uint8_t *)*(JSMapRecord **)((long)local_38.ptr + 0x70),
                 (long)*(int *)((long)local_38.ptr + 0x6c));
      }
      if (0 < *(int *)((long)obj_01.u.ptr + 0x58)) {
        lVar19 = 8;
        lVar15 = 0;
        do {
          obj_00.tag = *(int64_t *)(*(long *)((long)obj_01.u.ptr + 0x50) + lVar19);
          obj_00.u.ptr = ((JSValueUnion *)(*(long *)((long)obj_01.u.ptr + 0x50) + -8 + lVar19))->ptr
          ;
          iVar13 = JS_WriteObjectRec(pBVar18,obj_00);
          if (iVar13 != 0) {
            return -1;
          }
          lVar15 = lVar15 + 1;
          lVar19 = lVar19 + 0x10;
        } while (lVar15 < *(int *)((long)obj_01.u.ptr + 0x58));
        return 0;
      }
      return 0;
    }
    goto switchD_0012a873_caseD_fffffffa;
  case -1:
    if (*(uint *)&s->field_0x38 < 0x1000000) {
      if ((*(byte *)((long)obj_01.u.ptr + 5) & 0x40) != 0) {
        JS_ThrowTypeError(ctx,"circular reference");
        return -1;
      }
      *(byte *)((long)obj_01.u.ptr + 5) = *(byte *)((long)obj_01.u.ptr + 5) | 0x40;
    }
    else {
      if (((s->object_list).object_count != 0) &&
         (v = (s->object_list).hash_table[iVar13 * 0xc5b & (s->object_list).hash_size - 1],
         v != 0xffffffff)) {
        pJVar9 = (s->object_list).object_tab;
        do {
          if (pJVar9[v].obj == (JSObject *)obj_01.u.ptr) {
            if (-1 < (int)v) {
              dbuf_putc(&s->dbuf,'\x15');
              goto LAB_0012abdd;
            }
            break;
          }
          v = pJVar9[v].hash_next;
        } while (v != 0xffffffff);
      }
      iVar13 = js_object_list_add(ctx,&s->object_list,(JSObject *)obj_01.u.ptr);
      if (iVar13 != 0) {
        return -1;
      }
    }
    obj_04.tag = &switchD_0012af38::switchdataD_00178140;
    switch(*(short *)((long)obj_01.u.ptr + 6)) {
    case 1:
      obj_03.tag = (int64_t)&switchD_0012af38::switchdataD_00178140;
      obj_03.u.float64 = obj_01.u.float64;
      iVar13 = JS_WriteObjectTag(s,obj_03);
      break;
    case 2:
      iVar13 = JS_WriteArray(s,obj);
      break;
    default:
      if (8 < (ushort)(*(short *)((long)obj_01.u.ptr + 6) - 0x15U)) {
        JS_ThrowTypeError(s->ctx,"unsupported object class");
        *(byte *)((long)obj_01.u.ptr + 5) = *(byte *)((long)obj_01.u.ptr + 5) & 0xbf;
        return -1;
      }
      obj_04.u.float64 = obj_01.u.float64;
      iVar13 = JS_WriteTypedArray(s,obj_04);
      break;
    case 4:
    case 5:
    case 6:
      uVar14 = '\x14';
      goto LAB_0012af68;
    case 10:
      uVar14 = '\x13';
LAB_0012af68:
      dbuf_putc(&s->dbuf,uVar14);
      iVar13 = JS_WriteObjectRec(s,*(JSValue *)((long)obj_01.u.ptr + 0x30));
      break;
    case 0x13:
      obj_01.tag = (int64_t)&switchD_0012af38::switchdataD_00178140;
      iVar13 = JS_WriteArrayBuffer(s,obj_01);
      break;
    case 0x14:
      if (s->field_0x3a == '\0') {
        ctx = s->ctx;
        goto switchD_0012a873_caseD_fffffffa;
      }
      obj_02.tag = (int64_t)&switchD_0012af38::switchdataD_00178140;
      obj_02.u.float64 = obj_01.u.float64;
      iVar13 = JS_WriteSharedArrayBuffer(s,obj_02);
    }
    *(byte *)((long)obj_01.u.ptr + 5) = *(byte *)((long)obj_01.u.ptr + 5) & 0xbf;
LAB_0012af81:
    if (iVar13 != 0) {
      return -1;
    }
    return 0;
  }
  dbuf_putc(&s->dbuf,uVar14);
  return 0;
switchD_0012a873_caseD_fffffffa:
  JS_ThrowInternalError(ctx,"unsupported tag (%d)",obj.tag & 0xffffffff);
  return -1;
}

Assistant:

static int JS_WriteObjectRec(BCWriterState *s, JSValueConst obj)
{
    uint32_t tag;

    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        JS_ThrowStackOverflow(s->ctx);
        return -1;
    }

    tag = JS_VALUE_GET_NORM_TAG(obj);
    switch(tag) {
    case JS_TAG_NULL:
        bc_put_u8(s, BC_TAG_NULL);
        break;
    case JS_TAG_UNDEFINED:
        bc_put_u8(s, BC_TAG_UNDEFINED);
        break;
    case JS_TAG_BOOL:
        bc_put_u8(s, BC_TAG_BOOL_FALSE + JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_INT:
        bc_put_u8(s, BC_TAG_INT32);
        bc_put_sleb128(s, JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            bc_put_u8(s, BC_TAG_FLOAT64);
            u.d = JS_VALUE_GET_FLOAT64(obj);
            bc_put_u64(s, u.u64);
        }
        break;
    case JS_TAG_STRING:
        {
            JSString *p = JS_VALUE_GET_STRING(obj);
            bc_put_u8(s, BC_TAG_STRING);
            JS_WriteString(s, p);
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteFunctionTag(s, obj))
            goto fail;
        break;
    case JS_TAG_MODULE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteModule(s, obj))
            goto fail;
        break;
    case JS_TAG_OBJECT:
        {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            int ret, idx;
            
            if (s->allow_reference) {
                idx = js_object_list_find(s->ctx, &s->object_list, p);
                if (idx >= 0) {
                    bc_put_u8(s, BC_TAG_OBJECT_REFERENCE);
                    bc_put_leb128(s, idx);
                    break;
                } else {
                    if (js_object_list_add(s->ctx, &s->object_list, p))
                        goto fail;
                }
            } else {
                if (p->tmp_mark) {
                    JS_ThrowTypeError(s->ctx, "circular reference");
                    goto fail;
                }
                p->tmp_mark = 1;
            }
            switch(p->class_id) {
            case JS_CLASS_ARRAY:
                ret = JS_WriteArray(s, obj);
                break;
            case JS_CLASS_OBJECT:
                ret = JS_WriteObjectTag(s, obj);
                break;
            case JS_CLASS_ARRAY_BUFFER:
                ret = JS_WriteArrayBuffer(s, obj);
                break;
            case JS_CLASS_SHARED_ARRAY_BUFFER:
                if (!s->allow_sab)
                    goto invalid_tag;
                ret = JS_WriteSharedArrayBuffer(s, obj);
                break;
            case JS_CLASS_DATE:
                bc_put_u8(s, BC_TAG_DATE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            case JS_CLASS_NUMBER:
            case JS_CLASS_STRING:
            case JS_CLASS_BOOLEAN:
#ifdef CONFIG_BIGNUM
            case JS_CLASS_BIG_INT:
            case JS_CLASS_BIG_FLOAT:
            case JS_CLASS_BIG_DECIMAL:
#endif
                bc_put_u8(s, BC_TAG_OBJECT_VALUE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            default:
                if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                    p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_WriteTypedArray(s, obj);
                } else {
                    JS_ThrowTypeError(s->ctx, "unsupported object class");
                    ret = -1;
                }
                break;
            }
            p->tmp_mark = 0;
            if (ret)
                goto fail;
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
    case JS_TAG_BIG_FLOAT:
    case JS_TAG_BIG_DECIMAL:
        if (JS_WriteBigNum(s, obj))
            goto fail;
        break;
#endif
    default:
    invalid_tag:
        JS_ThrowInternalError(s->ctx, "unsupported tag (%d)", tag);
        goto fail;
    }
    return 0;

 fail:
    return -1;
}